

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O0

void Fxu_HeapSingleMoveDn(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single **pSingle2;
  Fxu_Single **pSingle2_00;
  Fxu_Single **local_30;
  Fxu_Single **ppSingle;
  Fxu_Single **ppChild2;
  Fxu_Single **ppChild1;
  Fxu_Single *pSingle_local;
  Fxu_HeapSingle *p_local;
  
  local_30 = p->pTree + pSingle->HNum;
  while( true ) {
    while( true ) {
      if (p->nItems < (*local_30)->HNum * 2) {
        return;
      }
      pSingle2 = p->pTree + ((*local_30)->HNum << 1);
      if ((*local_30)->HNum * 2 + 1 <= p->nItems) break;
      if ((*pSingle2)->Weight <= (*local_30)->Weight) {
        return;
      }
      Fxu_HeapSingleSwap(local_30,pSingle2);
      local_30 = pSingle2;
    }
    pSingle2_00 = p->pTree + ((*local_30)->HNum * 2 + 1);
    if (((*pSingle2)->Weight <= (*local_30)->Weight) &&
       ((*pSingle2_00)->Weight <= (*local_30)->Weight)) break;
    if ((*pSingle2)->Weight < (*pSingle2_00)->Weight) {
      Fxu_HeapSingleSwap(local_30,pSingle2_00);
      local_30 = pSingle2_00;
    }
    else {
      Fxu_HeapSingleSwap(local_30,pSingle2);
      local_30 = pSingle2;
    }
  }
  return;
}

Assistant:

void Fxu_HeapSingleMoveDn( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    Fxu_Single ** ppChild1, ** ppChild2, ** ppSingle;
    ppSingle = &FXU_HEAP_SINGLE_CURRENT(p, pSingle);
    while ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,*ppSingle) )
    { // if Child1 does not exist, Child2 also does not exists

        // get the children
        ppChild1 = &FXU_HEAP_SINGLE_CHILD1(p,*ppSingle);
        if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,*ppSingle) )
        {
            ppChild2 = &FXU_HEAP_SINGLE_CHILD2(p,*ppSingle);

            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
            { // Var is larger than both, skip
                break;
            }
            else
            { // Var is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_SINGLE_WEIGHT(*ppChild1) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                    // update the pointer
                    ppSingle = ppChild1;
                }
                else
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild2 );
                    // update the pointer
                    ppSingle = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) )
            { // Var is larger than Child1, skip
                break;
            }
            else
            { // Var is smaller than Child1, then swap them
                Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                // update the pointer
                ppSingle = ppChild1;
            }
        }
    }
}